

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool __thiscall
glslang::TProgram::mapIO(TProgram *this,TIoMapResolver *pResolver,TIoMapper *pIoMapper)

{
  int iVar1;
  int s;
  ulong uVar2;
  TIoMapper defaultIOMapper;
  TIoMapper local_28;
  
  if (this->linked != true) {
    return false;
  }
  SetThreadPoolAllocator(this->pool);
  local_28._vptr_TIoMapper = (_func_int **)&PTR__TIoMapper_00b0de68;
  if (pIoMapper == (TIoMapper *)0x0) {
    pIoMapper = &local_28;
  }
  uVar2 = 0;
  while ((this->intermediate[uVar2] == (TIntermediate *)0x0 ||
         (iVar1 = (*pIoMapper->_vptr_TIoMapper[2])
                            (pIoMapper,uVar2 & 0xffffffff,this->intermediate[uVar2],this->infoSink,
                             pResolver), (char)iVar1 != '\0'))) {
    uVar2 = uVar2 + 1;
    if (uVar2 == 0xe) {
      iVar1 = (*pIoMapper->_vptr_TIoMapper[3])(pIoMapper,pResolver,this->infoSink);
      return (bool)(char)iVar1;
    }
  }
  return false;
}

Assistant:

bool TProgram::mapIO(TIoMapResolver* pResolver, TIoMapper* pIoMapper)
{
    if (! linked)
        return false;

    SetThreadPoolAllocator(pool);

    TIoMapper* ioMapper = nullptr;
    TIoMapper defaultIOMapper;
    if (pIoMapper == nullptr)
        ioMapper = &defaultIOMapper;
    else
        ioMapper = pIoMapper;
    for (int s = 0; s < EShLangCount; ++s) {
        if (intermediate[s]) {
            if (! ioMapper->addStage((EShLanguage)s, *intermediate[s], *infoSink, pResolver))
                return false;
        }
    }

    return ioMapper->doMap(pResolver, *infoSink);
}